

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void compute_sgrproj_err(uint8_t *dat8,int width,int height,int dat_stride,uint8_t *src8,
                        int src_stride,int use_highbitdepth,int bit_depth,int pu_width,int pu_height
                        ,int ep,int32_t *flt0,int32_t *flt1,int flt_stride,int *exqd,int64_t *err,
                        aom_internal_error_info *error_info)

{
  int iVar1;
  _func_void_uint8_t_ptr_int_int_int_uint8_t_ptr_int_int32_t_ptr_int_int32_t_ptr_int_int64_t_2__ptr_int64_t_ptr_sgr_params_type_ptr
  **pp_Var2;
  int64_t iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  sgr_params_type *params;
  int p;
  int32_t *piVar11;
  int32_t *piVar12;
  int j;
  long lVar13;
  int32_t *piVar14;
  int32_t *piVar15;
  int iVar16;
  bool bVar17;
  uint8_t *local_b0;
  int64_t local_a8;
  long lStack_a0;
  int64_t H [2] [2];
  
  lVar10 = (long)pu_height;
  lVar5 = (long)pu_width;
  piVar11 = flt0;
  piVar14 = flt1;
  local_b0 = dat8;
  for (lVar6 = 0; lVar6 < height; lVar6 = lVar6 + lVar10) {
    iVar16 = height - (int)lVar6;
    if (pu_height <= iVar16) {
      iVar16 = pu_height;
    }
    piVar12 = piVar11;
    piVar15 = piVar14;
    iVar4 = width;
    for (lVar13 = 0; lVar13 < width; lVar13 = lVar13 + lVar5) {
      iVar1 = iVar4;
      if (pu_width <= iVar4) {
        iVar1 = pu_width;
      }
      iVar1 = (*av1_selfguided_restoration)
                        (local_b0 + lVar13,iVar1,iVar16,dat_stride,piVar12,piVar15,flt_stride,ep,
                         bit_depth,use_highbitdepth);
      if (iVar1 != 0) {
        aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,
                           "Error allocating buffer in av1_selfguided_restoration");
      }
      piVar15 = piVar15 + lVar5;
      piVar12 = piVar12 + lVar5;
      iVar4 = iVar4 - pu_width;
    }
    piVar14 = piVar14 + flt_stride * lVar10;
    piVar11 = piVar11 + flt_stride * lVar10;
    local_b0 = local_b0 + dat_stride * lVar10;
  }
  lVar5 = (long)ep;
  params = av1_sgr_params + lVar5;
  H[1][0] = 0;
  H[1][1] = 0;
  H[0][0] = 0;
  H[0][1] = 0;
  local_a8 = 0;
  lStack_a0 = 0;
  if (use_highbitdepth == 0) {
    if ((width & 7U) == 0) {
      pp_Var2 = &av1_calc_proj_params;
      goto LAB_001de1a1;
    }
    av1_calc_proj_params_c
              (src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
               &local_a8,params);
  }
  else if ((width & 7U) == 0) {
    pp_Var2 = &av1_calc_proj_params_high_bd;
LAB_001de1a1:
    (**pp_Var2)(src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
                &local_a8,params);
  }
  else {
    av1_calc_proj_params_high_bd_c
              (src8,width,height,src_stride,dat8,dat_stride,flt0,flt_stride,flt1,flt_stride,H,
               &local_a8,params);
  }
  iVar16 = params->r[0];
  if (iVar16 == 0) {
    if (H[1][1] == 0) {
      iVar4 = 0x80;
    }
    else {
      iVar4 = 0x80 - (int)((H[1][1] / (long)((ulong)(-1 < lStack_a0) * 4 + -2) + lStack_a0 * 0x80) /
                          H[1][1]);
    }
    *exqd = 0;
  }
  else {
    iVar1 = av1_sgr_params[lVar5].r[1];
    if (iVar1 == 0) {
      iVar4 = 0x80;
      if (H[0][0] == 0) {
        iVar9 = 0;
      }
      else {
        iVar9 = (int)((H[0][0] / (long)((ulong)(-1 < local_a8) * 4 + -2) + local_a8 * 0x80) /
                     H[0][0]);
      }
    }
    else {
      lVar6 = H[1][1] * H[0][0] - H[1][0] * H[0][1];
      if (lVar6 == 0) {
        iVar9 = 0;
        iVar4 = 0x80;
      }
      else {
        lVar10 = H[1][1] * local_a8 - H[0][1] * lStack_a0;
        bVar17 = -1 < lVar10;
        if ((uint)((ulong)(lVar10 + -0x100000000000000) >> 0x39) < 0x7f) {
          lVar13 = lVar6 / 0x80;
        }
        else {
          lVar10 = lVar10 * 0x80;
          lVar13 = lVar6;
        }
        iVar9 = (int)((lVar13 / (long)((ulong)bVar17 * 4 + -2) + lVar10) / lVar13);
        lVar10 = lStack_a0 * H[0][0] - local_a8 * H[1][0];
        if (lVar10 + 0xff00000000000000U < 0xfe00000000000000) {
          lVar6 = lVar6 / 0x80;
          lVar13 = lVar10;
        }
        else {
          lVar13 = lVar10 * 0x80;
        }
        iVar4 = 0x80 - (int)((lVar6 / (long)((ulong)(-1 < lVar10) * 4 + -2) + lVar13) / lVar6);
      }
    }
    iVar7 = 0x1f;
    if (iVar9 < 0x1f) {
      iVar7 = iVar9;
    }
    iVar9 = -0x60;
    if (-0x60 < iVar7) {
      iVar9 = iVar7;
    }
    *exqd = iVar9;
    if (iVar1 == 0) {
      iVar4 = 0x5f;
      goto LAB_001de3e9;
    }
    iVar4 = iVar4 - iVar9;
  }
  iVar1 = 0x5f;
  if (iVar4 < 0x5f) {
    iVar1 = iVar4;
  }
  iVar4 = -0x20;
  if (-0x20 < iVar1) {
    iVar4 = iVar1;
  }
LAB_001de3e9:
  exqd[1] = iVar4;
  lVar6 = get_pixel_proj_error
                    (src8,width,height,src_stride,dat8,dat_stride,use_highbitdepth,flt0,flt_stride,
                     flt1,flt_stride,exqd,params);
  uVar8 = 2;
  do {
    if (uVar8 == 0) {
      *err = lVar6;
      return;
    }
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      if ((iVar16 != 0 || (int)lVar10 != 0) && ((lVar10 != 1 || (av1_sgr_params[lVar5].r[1] != 0))))
      {
        iVar4 = (&DAT_00454f68)[lVar10];
        bVar17 = true;
        while (iVar4 <= (int)(exqd[lVar10] - uVar8)) {
          exqd[lVar10] = exqd[lVar10] - uVar8;
          iVar3 = get_pixel_proj_error
                            (src8,width,height,src_stride,dat8,dat_stride,use_highbitdepth,flt0,
                             flt_stride,flt1,flt_stride,exqd,params);
          if (lVar6 < iVar3) {
            exqd[lVar10] = exqd[lVar10] + uVar8;
            break;
          }
          bVar17 = false;
          lVar6 = iVar3;
          if (uVar8 != 2) goto LAB_001de5d2;
        }
        if (!bVar17) break;
        iVar4 = (&DAT_00454f70)[lVar10];
        lVar13 = lVar6;
        do {
          lVar6 = lVar13;
          if (iVar4 < (int)(exqd[lVar10] + uVar8)) break;
          exqd[lVar10] = exqd[lVar10] + uVar8;
          lVar6 = get_pixel_proj_error
                            (src8,width,height,src_stride,dat8,dat_stride,use_highbitdepth,flt0,
                             flt_stride,flt1,flt_stride,exqd,params);
          if (lVar13 < lVar6) {
            exqd[lVar10] = exqd[lVar10] - uVar8;
            lVar6 = lVar13;
            break;
          }
          lVar13 = lVar6;
        } while (uVar8 == 2);
      }
    }
LAB_001de5d2:
    uVar8 = uVar8 >> 1;
  } while( true );
}

Assistant:

static inline void compute_sgrproj_err(
    const uint8_t *dat8, const int width, const int height,
    const int dat_stride, const uint8_t *src8, const int src_stride,
    const int use_highbitdepth, const int bit_depth, const int pu_width,
    const int pu_height, const int ep, int32_t *flt0, int32_t *flt1,
    const int flt_stride, int *exqd, int64_t *err,
    struct aom_internal_error_info *error_info) {
  int exq[2];
  apply_sgr(ep, dat8, width, height, dat_stride, use_highbitdepth, bit_depth,
            pu_width, pu_height, flt0, flt1, flt_stride, error_info);
  const sgr_params_type *const params = &av1_sgr_params[ep];
  get_proj_subspace(src8, width, height, src_stride, dat8, dat_stride,
                    use_highbitdepth, flt0, flt_stride, flt1, flt_stride, exq,
                    params);
  encode_xq(exq, exqd, params);
  *err = finer_search_pixel_proj_error(
      src8, width, height, src_stride, dat8, dat_stride, use_highbitdepth, flt0,
      flt_stride, flt1, flt_stride, 2, exqd, params);
}